

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O0

SUNNonlinearSolver SUNNonlinSol_FixedPointSens(int count,N_Vector y,int m,SUNContext sunctx)

{
  SUNNonlinearSolver p_Var1;
  undefined8 in_RCX;
  int m_00;
  undefined4 in_EDX;
  N_Vector w;
  SUNNonlinearSolver NLS;
  N_Vector in_stack_ffffffffffffffd0;
  SUNContext in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  m_00 = (int)((ulong)in_RCX >> 0x20);
  N_VNew_SensWrapper((int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),in_stack_ffffffffffffffd0);
  p_Var1 = SUNNonlinSol_FixedPoint
                     ((N_Vector)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),m_00,
                      in_stack_ffffffffffffffd8);
  N_VDestroy((N_Vector)0x1179ecb);
  return p_Var1;
}

Assistant:

SUNNonlinearSolver SUNNonlinSol_FixedPointSens(int count, N_Vector y, int m,
                                               SUNContext sunctx)
{
  SUNNonlinearSolver NLS;
  N_Vector w;

  /* create sensitivity vector wrapper */
  w = N_VNew_SensWrapper(count, y);

  /* create nonlinear solver using sensitivity vector wrapper */
  NLS = SUNNonlinSol_FixedPoint(w, m, sunctx);

  /* free sensitivity vector wrapper */
  N_VDestroy(w);

  /* return NLS object */
  return(NLS);
}